

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O1

RDL_cycle * RDL_cycleIteratorGetCycle(RDL_cycleIterator *it)

{
  RDL_node *pRVar1;
  uchar uVar2;
  RDL_cycle *pRVar3;
  RDL_edge *paRVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (it == (RDL_cycleIterator *)0x0) {
    pcVar6 = "Iterator is NULL!\n";
  }
  else {
    if (it->end == '\0') {
      if (it->mode == 'b') {
        pRVar3 = (RDL_cycle *)malloc(0x18);
        paRVar4 = (RDL_edge *)malloc(0x200);
        pRVar3->edges = paRVar4;
        pRVar3->urf = it->running_urf;
        pRVar3->rcf = it->running_rcf;
        if (it->data->bccGraphs->bcc_graphs[it->bcc_index]->E == 0) {
          uVar5 = 0;
        }
        else {
          uVar8 = 0;
          uVar7 = 0x40;
          uVar5 = 0;
          do {
            uVar2 = RDL_bitset_test(it->compressed_cycle,(uint)uVar8);
            if (uVar2 != '\0') {
              if ((uint)uVar7 <= uVar5) {
                uVar7 = (ulong)((uint)uVar7 * 2);
                paRVar4 = (RDL_edge *)realloc(pRVar3->edges,uVar7 * 8);
                pRVar3->edges = paRVar4;
              }
              pRVar1 = it->data->graph->edges
                       [it->data->bccGraphs->edge_from_bcc_mapping[it->bcc_index][uVar8]];
              paRVar4 = pRVar3->edges;
              paRVar4[uVar5][0] = *pRVar1;
              paRVar4[uVar5][1] = pRVar1[1];
              uVar5 = uVar5 + 1;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < it->data->bccGraphs->bcc_graphs[it->bcc_index]->E);
        }
        paRVar4 = (RDL_edge *)realloc(pRVar3->edges,(ulong)uVar5 << 3);
        pRVar3->edges = paRVar4;
        pRVar3->weight = uVar5;
        return pRVar3;
      }
      (*RDL_outputFunc)(RDL_ERROR,"Cycle conversion only works for edge defined cycles!\n");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                    ,0x204,"RDL_cycle *RDL_cycleIteratorGetCycle(RDL_cycleIterator *)");
    }
    pcVar6 = "Cannot retrieve cycle of iterator at end!\n";
  }
  (*RDL_outputFunc)(RDL_ERROR,pcVar6);
  return (RDL_cycle *)0x0;
}

Assistant:

RDL_cycle* RDL_cycleIteratorGetCycle(RDL_cycleIterator* it)
{
  unsigned edgeCount = 0, j, mapped_edge, alloced = 64;
  RDL_cycle* rdl_cycle;

  if (it == NULL) {
    RDL_outputFunc(RDL_ERROR, "Iterator is NULL!\n");
    return NULL;
  }

  if (RDL_cycleIteratorAtEnd(it)) {
    RDL_outputFunc(RDL_ERROR, "Cannot retrieve cycle of iterator at end!\n");
    return NULL;
  }

  if (it->mode != 'b') {
    RDL_outputFunc(RDL_ERROR, "Cycle conversion only works for edge defined cycles!\n");
    /* will never happen, when using the public interface! */
    assert(0);
    return NULL;
  }

  rdl_cycle = malloc(sizeof(*rdl_cycle));

  rdl_cycle->edges = malloc(alloced * sizeof(*rdl_cycle->edges));
  rdl_cycle->urf = it->running_urf;
  rdl_cycle->rcf = it->running_rcf;

  for(j=0; j < it->data->bccGraphs->bcc_graphs[it->bcc_index]->E; ++j) {
    if(RDL_bitset_test(it->compressed_cycle, j)) {
      if (edgeCount >= alloced) {
        alloced *= 2;
        rdl_cycle->edges = realloc(rdl_cycle->edges, alloced * sizeof(*rdl_cycle->edges));
      }
      mapped_edge = it->data->bccGraphs->edge_from_bcc_mapping[it->bcc_index][j];
      rdl_cycle->edges[edgeCount][0] = it->data->graph->edges[mapped_edge][0];
      rdl_cycle->edges[edgeCount][1] = it->data->graph->edges[mapped_edge][1];
      ++edgeCount;
    }
  }

  rdl_cycle->edges = realloc(rdl_cycle->edges, edgeCount * sizeof(*rdl_cycle->edges));
  rdl_cycle->weight = edgeCount;

  return rdl_cycle;
}